

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

void acutest_line_indent_(int level)

{
  uint uVar1;
  
  uVar1 = level * 2;
  if (acutest_tap_ == '\x01') {
    uVar1 = uVar1 - 1;
    putchar(0x23);
  }
  for (; 0x10 < (int)uVar1; uVar1 = uVar1 - 0x10) {
    printf("%s","                ");
  }
  printf("%.*s",(ulong)uVar1,"                ");
  return;
}

Assistant:

static void
acutest_line_indent_(int level)
{
    static const char spaces[] = "                ";
    int n = level * 2;

    if(acutest_tap_  &&  n > 0) {
        n--;
        printf("#");
    }

    while(n > 16) {
        printf("%s", spaces);
        n -= 16;
    }
    printf("%.*s", n, spaces);
}